

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int big2_scanComment(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  byte *pbVar6;
  
  if (ptr == end) {
    return -1;
  }
  iVar4 = 0;
  iVar5 = 0;
  if ((*ptr == '\0') && (iVar5 = iVar4, ptr[1] == '-')) {
    pbVar1 = (byte *)(ptr + 2);
LAB_0047aebc:
    while( true ) {
      pbVar6 = pbVar1;
      if (pbVar6 == (byte *)end) {
        return -1;
      }
      bVar2 = *pbVar6;
      if (3 < bVar2 - 0xd8) break;
switchD_0047af3d_caseD_7:
      if ((long)end - (long)pbVar6 < 4) {
        return -2;
      }
      pbVar1 = pbVar6 + 4;
    }
    ptr = (char *)pbVar6;
    if (bVar2 == 0) {
      cVar3 = *(char *)((long)enc[1].scanners + (ulong)pbVar6[1]);
      switch(cVar3) {
      case '\0':
      case '\x01':
      case '\b':
        goto switchD_0047af3d_caseD_0;
      case '\x02':
      case '\x03':
      case '\x04':
        break;
      case '\x05':
        if ((long)end - (long)pbVar6 < 2) {
          return -2;
        }
        break;
      case '\x06':
        if ((long)end - (long)pbVar6 < 3) {
          return -2;
        }
        pbVar1 = pbVar6 + 3;
        goto LAB_0047aebc;
      case '\a':
        goto switchD_0047af3d_caseD_7;
      default:
        if (cVar3 != '\x1b') break;
        pbVar1 = pbVar6 + 2;
        if (pbVar1 == (byte *)end) {
          return -1;
        }
        if ((*pbVar1 != 0) || (pbVar6[3] != 0x2d)) goto LAB_0047aebc;
        ptr = (char *)(pbVar6 + 4);
        if (ptr == end) {
          return -1;
        }
        iVar5 = 0;
        if (*ptr == 0) {
          if (pbVar6[5] == 0x3e) {
            ptr = (char *)(pbVar6 + 6);
          }
          iVar5 = 0xd;
          if (pbVar6[5] != 0x3e) {
            iVar5 = 0;
          }
        }
        goto switchD_0047af3d_caseD_0;
      }
    }
    else {
      if (bVar2 != 0xff) {
        if (3 < bVar2 - 0xdc) goto switchD_0047af3d_caseD_2;
        goto switchD_0047af3d_caseD_0;
      }
      if (0xfd < pbVar6[1]) goto switchD_0047af3d_caseD_0;
    }
switchD_0047af3d_caseD_2:
    pbVar1 = pbVar6 + 2;
    goto LAB_0047aebc;
  }
switchD_0047af3d_caseD_0:
  *nextTokPtr = ptr;
  return iVar5;
}

Assistant:

static
int PREFIX(scanComment)(const ENCODING *enc, const char *ptr, const char *end,
                        const char **nextTokPtr)
{
  if (ptr != end) {
    if (!CHAR_MATCHES(enc, ptr, ASCII_MINUS)) {
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
    ptr += MINBPC(enc);
    while (ptr != end) {
      switch (BYTE_TYPE(enc, ptr)) {
      INVALID_CASES(ptr, nextTokPtr)
      case BT_MINUS:
        if ((ptr += MINBPC(enc)) == end)
          return XML_TOK_PARTIAL;
        if (CHAR_MATCHES(enc, ptr, ASCII_MINUS)) {
          if ((ptr += MINBPC(enc)) == end)
            return XML_TOK_PARTIAL;
          if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          *nextTokPtr = ptr + MINBPC(enc);
          return XML_TOK_COMMENT;
        }
        break;
      default:
        ptr += MINBPC(enc);
        break;
      }
    }
  }
  return XML_TOK_PARTIAL;
}